

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::newArray(QPDFObjectHandle *this,Rectangle *rect)

{
  initializer_list<QPDFObjectHandle> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle *local_b8;
  allocator<QPDFObjectHandle> local_95 [13];
  QPDFObjectHandle *local_88;
  undefined1 local_80 [32];
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_30;
  Rectangle *local_18;
  Rectangle *rect_local;
  
  local_88 = (QPDFObjectHandle *)local_80;
  local_18 = rect;
  rect_local = (Rectangle *)this;
  newReal(local_88,rect->llx,0,true);
  local_88 = (QPDFObjectHandle *)(local_80 + 0x10);
  newReal(local_88,local_18->lly,0,true);
  local_88 = &local_60;
  newReal(local_88,local_18->urx,0,true);
  local_88 = &local_50;
  newReal(local_88,local_18->ury,0,true);
  local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
  std::allocator<QPDFObjectHandle>::allocator(local_95);
  __l._M_len = (size_type)
               local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_30,__l,local_95);
  newArray(this,&local_30);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_30);
  std::allocator<QPDFObjectHandle>::~allocator(local_95);
  local_b8 = &local_40;
  do {
    local_b8 = local_b8 + -1;
    ~QPDFObjectHandle(local_b8);
  } while (local_b8 != (QPDFObjectHandle *)local_80);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(Rectangle const& rect)
{
    return newArray({newReal(rect.llx), newReal(rect.lly), newReal(rect.urx), newReal(rect.ury)});
}